

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O2

FloatingConstant * __thiscall
psy::TextElementTable<psy::C::FloatingConstant>::findOrInsert
          (TextElementTable<psy::C::FloatingConstant> *this,char *chars,uint size)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  FloatingConstant *this_00;
  FloatingConstant **ppFVar5;
  
  this_00 = find(this,chars,size);
  if (this_00 == (FloatingConstant *)0x0) {
    iVar3 = this->count_ + 1;
    this->count_ = iVar3;
    if (iVar3 == this->allocated_) {
      iVar4 = 4;
      if (iVar3 != 0) {
        iVar4 = iVar3 * 2;
      }
      this->allocated_ = iVar4;
      ppFVar5 = (FloatingConstant **)realloc(this->elements_,(long)iVar4 << 3);
      this->elements_ = ppFVar5;
    }
    this_00 = (FloatingConstant *)operator_new(0x30);
    C::FloatingConstant::FloatingConstant(this_00,chars,size);
    iVar3 = this->count_;
    this->elements_[iVar3] = this_00;
    ppFVar5 = this->buckets_;
    if ((ppFVar5 == (FloatingConstant **)0x0) ||
       (iVar3 = iVar3 * 5, uVar1 = this->bucketCount_,
       SBORROW4(iVar3,uVar1 * 3) == (int)(iVar3 + uVar1 * -3) < 0)) {
      rehash(this);
    }
    else {
      uVar2 = (ulong)*(uint *)&(this_00->super_Lexeme).field_0x18 % (ulong)uVar1;
      *(FloatingConstant **)&(this_00->super_Lexeme).field_0x20 = ppFVar5[uVar2];
      ppFVar5[uVar2] = this_00;
    }
  }
  return this_00;
}

Assistant:

const ElemT* findOrInsert(const char *chars, unsigned int size)
    {
        ElemT* elem = const_cast<ElemT*>(find(chars, size));
        if (elem)
            return elem;

        if (++count_ == allocated_) {
            if (!allocated_)
                allocated_ = 4;
            else
                allocated_ <<= 1;
            elements_ = (ElemT**) std::realloc(elements_, sizeof(ElemT*)* allocated_);
        }

        elem = new ElemT(chars, size);
        elements_[count_] = elem;

        if (!buckets_ || count_ * 5 >= bucketCount_ * 3)
            rehash();
        else {
            unsigned h = elem->hashCode() % bucketCount_;
            elem ->next_ = buckets_[h];
            buckets_[h] = elem;
        }

        return elem;
    }